

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  CppType CVar1;
  Extension *pEVar2;
  Extension *extension;
  LogMessage *in_stack_ffffffffffffff28;
  LogMessage *in_stack_ffffffffffffff30;
  LogLevel in_stack_ffffffffffffff3c;
  LogMessage *in_stack_ffffffffffffff40;
  ExtensionSet *in_stack_ffffffffffffff48;
  RepeatedField<int> *in_stack_ffffffffffffff90;
  
  pEVar2 = FindOrNull(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(char *)in_stack_ffffffffffffff30
               ,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    LogMessage::~LogMessage((LogMessage *)0x74ace1);
  }
  CVar1 = anon_unknown_19::cpp_type('\0');
  switch(CVar1) {
  case CPPTYPE_INT32:
    RepeatedField<int>::RemoveLast(in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::RemoveLast((RepeatedField<long> *)in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::RemoveLast
              ((RepeatedField<unsigned_int> *)in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::RemoveLast
              ((RepeatedField<unsigned_long> *)in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::RemoveLast((RepeatedField<double> *)in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::RemoveLast((RepeatedField<float> *)in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::RemoveLast((RepeatedField<bool> *)in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_ENUM:
    RepeatedField<int>::RemoveLast(in_stack_ffffffffffffff90);
    break;
  case CPPTYPE_STRING:
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::RemoveLast((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x74ae9a);
    break;
  case CPPTYPE_MESSAGE:
    RepeatedPtrField<google::protobuf::MessageLite>::RemoveLast
              ((RepeatedPtrField<google::protobuf::MessageLite> *)0x74aeac);
  }
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}